

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

size_t ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl,UA_Job **jobs)

{
  void *pvVar1;
  undefined4 *puVar2;
  UA_Job *pUVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  
  pvVar1 = nl->handle;
  sVar6 = 0;
  UA_LOG_INFO(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
              "Shutting down the TCP network layer with %d open connection(s)",
              *(undefined8 *)((long)pvVar1 + 0x28));
  shutdown(*(int *)((long)pvVar1 + 0x20),2);
  close(*(int *)((long)pvVar1 + 0x20));
  pUVar3 = (UA_Job *)malloc(*(long *)((long)pvVar1 + 0x28) << 6);
  if (pUVar3 != (UA_Job *)0x0) {
    uVar7 = *(ulong *)((long)pvVar1 + 0x28);
    if (uVar7 != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        puVar2 = *(undefined4 **)(*(long *)((long)pvVar1 + 0x30) + lVar5);
        *puVar2 = 2;
        shutdown(puVar2[0xe],2);
        close(puVar2[0xe]);
        (&pUVar3->type)[lVar5] = UA_JOBTYPE_DETACHCONNECTION;
        *(undefined8 *)((long)&pUVar3->job + lVar5 * 4) =
             *(undefined8 *)(*(long *)((long)pvVar1 + 0x30) + lVar5);
        (&pUVar3[1].type)[lVar5] = UA_JOBTYPE_METHODCALL_DELAYED;
        *(code **)((long)&pUVar3[1].job + lVar5 * 4 + 8) = FreeConnectionCallback;
        *(undefined8 *)((long)&pUVar3[1].job + lVar5 * 4) =
             *(undefined8 *)(*(long *)((long)pvVar1 + 0x30) + lVar5);
        uVar4 = uVar4 + 1;
        uVar7 = *(ulong *)((long)pvVar1 + 0x28);
        lVar5 = lVar5 + 0x10;
      } while (uVar4 < uVar7);
    }
    *jobs = pUVar3;
    sVar6 = uVar7 * 2;
  }
  return sVar6;
}

Assistant:

static size_t
ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl, UA_Job **jobs) {
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                "Shutting down the TCP network layer with %d open connection(s)",
                layer->mappingsSize);
    shutdown((SOCKET)layer->serversockfd,2);
    CLOSESOCKET(layer->serversockfd);
    UA_Job *items = malloc(sizeof(UA_Job) * layer->mappingsSize * 2);
    if(!items)
        return 0;
    for(size_t i = 0; i < layer->mappingsSize; ++i) {
        socket_close(layer->mappings[i].connection);
        items[i*2].type = UA_JOBTYPE_DETACHCONNECTION;
        items[i*2].job.closeConnection = layer->mappings[i].connection;
        items[(i*2)+1].type = UA_JOBTYPE_METHODCALL_DELAYED;
        items[(i*2)+1].job.methodCall.method = FreeConnectionCallback;
        items[(i*2)+1].job.methodCall.data = layer->mappings[i].connection;
    }
#ifdef _WIN32
    WSACleanup();
#endif
    *jobs = items;
    return layer->mappingsSize*2;
}